

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O1

void __thiscall
absl::lts_20250127::strings_internal::BigUnsigned<4>::MultiplyBy(BigUnsigned<4> *this,uint64_t v)

{
  uint32_t words [2];
  uint64_t local_8;
  
  local_8 = v;
  if (v >> 0x20 == 0) {
    MultiplyBy(this,(uint32_t)v);
    return;
  }
  MultiplyBy(this,2,(uint32_t *)&local_8);
  return;
}

Assistant:

void MultiplyBy(uint64_t v) {
    uint32_t words[2];
    words[0] = static_cast<uint32_t>(v);
    words[1] = static_cast<uint32_t>(v >> 32);
    if (words[1] == 0) {
      MultiplyBy(words[0]);
    } else {
      MultiplyBy(2, words);
    }
  }